

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::TagPattern::~TagPattern(TagPattern *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TagPattern_00237bf0;
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  Pattern::~Pattern((Pattern *)0x1a0e84);
  return;
}

Assistant:

TestSpec::TagPattern::~TagPattern() {}